

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase222::run(TestCase222 *this)

{
  void *pvVar1;
  uchar *puVar2;
  ArrayPtr<unsigned_char> scratch;
  Arena arena;
  anon_union_40_2_42f82436 anon_var_0;
  Arena local_68;
  uchar *local_48;
  uchar *local_40;
  uchar local_38 [24];
  uchar local_20 [10];
  uchar local_16 [6];
  
  scratch.size_ = 0x22;
  scratch.ptr = local_38;
  Arena::Arena(&local_68,scratch);
  pvVar1 = Arena::allocateBytes(&local_68,0,1,false);
  Arena::allocateBytes(&local_68,(size_t)(local_20 + -(long)pvVar1),1,false);
  puVar2 = (uchar *)Arena::allocateBytes(&local_68,2,2,false);
  if ((local_20 != puVar2) && (_::Debug::minSeverity < 3)) {
    local_48 = puVar2;
    local_40 = local_20;
    _::Debug::log<char_const(&)[65],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xee,ERROR,
               "\"failed: expected \" \"(scratch + 24) == (reinterpret_cast<byte*>(&i))\", scratch + 24, reinterpret_cast<byte*>(&i)"
               ,(char (*) [65])"failed: expected (scratch + 24) == (reinterpret_cast<byte*>(&i))",
               &local_40,&local_48);
  }
  puVar2 = (uchar *)Arena::allocateBytes(&local_68,8,8,false);
  if (((local_38 <= puVar2) && (puVar2 <= local_16)) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"reinterpret_cast<byte*>(&i2) < scratch || reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch)\""
               ,(char (*) [116])
                "failed: expected reinterpret_cast<byte*>(&i2) < scratch || reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch)"
              );
  }
  Arena::~Arena(&local_68);
  return;
}

Assistant:

TEST(Arena, EndOfChunkAlignment) {
  union {
    byte scratch[34];
    uint64_t align;
  };
  Arena arena(arrayPtr(scratch, sizeof(scratch)));

  // Figure out where we are...
  byte* start = arena.allocateArray<byte>(0).begin();

  // Allocate enough space so that we're 24 bytes into the scratch space.  (On 64-bit systems, this
  // should be zero.)
  arena.allocateArray<byte>(24 - (start - scratch));

  // Allocating a 16-bit integer works.  Now we're at 26 bytes; 8 bytes are left.
  uint16_t& i = arena.allocate<uint16_t>();
  EXPECT_EQ(scratch + 24, reinterpret_cast<byte*>(&i));

  // Although there is technically enough space to allocate a uint64, it is not aligned correctly,
  // so it will be allocated elsewhere instead.
  uint64_t& i2 = arena.allocate<uint64_t>();
  EXPECT_TRUE(reinterpret_cast<byte*>(&i2) < scratch ||
              reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch));
}